

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O3

int Fxch_ManComputeLevelDiv(Fxch_Man_t *pFxchMan,Vec_Int_t *vCubeFree)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  
  if ((long)vCubeFree->nSize < 1) {
    iVar2 = 0;
  }
  else {
    lVar3 = 0;
    iVar2 = 0;
    do {
      if (vCubeFree->pArray[lVar3] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar4 = (uint)vCubeFree->pArray[lVar3] >> 2;
      if (pFxchMan->vLevels->nSize <= (int)uVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = pFxchMan->vLevels->pArray[uVar4];
      if (iVar2 <= iVar1) {
        iVar2 = iVar1;
      }
      lVar3 = lVar3 + 1;
    } while (vCubeFree->nSize != lVar3);
  }
  iVar1 = 800;
  if (iVar2 < 800) {
    iVar1 = iVar2;
  }
  return iVar1;
}

Assistant:

int Fxch_ManComputeLevelDiv( Fxch_Man_t* pFxchMan,
                             Vec_Int_t* vCubeFree )
{
    int i,
        Lit,
        Level = 0;

    Vec_IntForEachEntry( vCubeFree, Lit, i )
        Level = Abc_MaxInt( Level, Vec_IntEntry( pFxchMan->vLevels, Abc_Lit2Var( Abc_Lit2Var( Lit ) ) ) );

    return Abc_MinInt( Level, 800 );
}